

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O0

TypedAttribute<Imf_3_3::Rational> *
Imf_3_3::TypedAttribute<Imf_3_3::Rational>::cast(Attribute *attribute)

{
  TypedAttribute<Imf_3_3::Rational> *this;
  char *text;
  long in_RDI;
  TypedAttribute<Imf_3_3::Rational> *t;
  
  if (in_RDI == 0) {
    this = (TypedAttribute<Imf_3_3::Rational> *)0x0;
  }
  else {
    this = (TypedAttribute<Imf_3_3::Rational> *)
           __dynamic_cast(in_RDI,&Attribute::typeinfo,&typeinfo,0);
  }
  if (this == (TypedAttribute<Imf_3_3::Rational> *)0x0) {
    text = (char *)__cxa_allocate_exception(0x48);
    Iex_3_3::TypeExc::TypeExc((TypeExc *)this,text);
    __cxa_throw(text,&Iex_3_3::TypeExc::typeinfo,Iex_3_3::TypeExc::~TypeExc);
  }
  return this;
}

Assistant:

TypedAttribute<T>*
TypedAttribute<T>::cast (Attribute* attribute)
{
    TypedAttribute<T>* t = dynamic_cast<TypedAttribute<T>*> (attribute);

    if (t == 0) throw IEX_NAMESPACE::TypeExc ("Unexpected attribute type.");

    return t;
}